

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O2

void __thiscall
AssertionTest_assertLeHandlerShouldBeCalled_Test::TestBody
          (AssertionTest_assertLeHandlerShouldBeCalled_Test *this)

{
  int32_t *actual;
  AssertionMessage *pAVar1;
  AssertionMessage *pAVar2;
  ostream *poVar3;
  char *pcVar4;
  AssertionMessage *in_stack_fffffffffffffdd8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_220;
  int32_t b;
  int32_t a;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_210;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  string local_200;
  AssertionResult gtest_ar_1;
  stringstream expectedMsg;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  ostream local_190 [376];
  
  a = 2;
  b = 1;
  cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_200);
  pAVar1 = cppassert::internal::AssertionMessage::operator<<((AssertionMessage *)&local_200,&a);
  cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_220);
  pAVar2 = cppassert::internal::AssertionMessage::operator<<((AssertionMessage *)&local_220,&b);
  cppassert::internal::getPredicateAssertionFailureMessage_abi_cxx11_
            ((string *)&gtest_ar_1,(internal *)"<=","a","b",(char *)pAVar1,pAVar2,
             in_stack_fffffffffffffdd8);
  cppassert::AssertionFailure::AssertionFailure
            ((AssertionFailure *)&expectedMsg,0x9e,
             "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
             ,"virtual void AssertionTest_assertLeHandlerShouldBeCalled_Test::TestBody()",
             (string *)&gtest_ar_1);
  cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_210);
  cppassert::AssertionFailure::onAssertionFailure
            ((AssertionFailure *)&expectedMsg,(AssertionMessage *)&local_210);
  if (local_210._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_210._M_head_impl + 8))();
  }
  cppassert::AssertionFailure::~AssertionFailure((AssertionFailure *)&expectedMsg);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (local_220._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_220._M_head_impl + 8))();
  }
  if ((long *)CONCAT44(local_200._M_dataplus._M_p._4_4_,local_200._M_dataplus._M_p._0_4_) !=
      (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_200._M_dataplus._M_p._4_4_,local_200._M_dataplus._M_p._0_4_
                                  ) + 8))();
  }
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  actual = &(this->super_AssertionTest).assertionHandlerCounter_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&expectedMsg,"1","assertionHandlerCounter_",(int *)&gtest_ar_1,actual);
  if (expectedMsg == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (local_198.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_198.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,0x9f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_198);
  std::__cxx11::stringstream::stringstream((stringstream *)&expectedMsg);
  poVar3 = std::operator<<(local_190,"Expected message: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,a);
  poVar3 = std::operator<<(poVar3," ");
  std::ostream::operator<<(poVar3,b);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_AssertionTest).expectedStreamMessage_,(string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (b < a) {
    cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_220);
    pAVar1 = cppassert::internal::AssertionMessage::operator<<((AssertionMessage *)&local_220,&a);
    cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_210);
    pAVar2 = cppassert::internal::AssertionMessage::operator<<((AssertionMessage *)&local_210,&b);
    cppassert::internal::getPredicateAssertionFailureMessage_abi_cxx11_
              (&local_200,(internal *)"<=","a","b",(char *)pAVar1,pAVar2,in_stack_fffffffffffffdd8);
    cppassert::AssertionFailure::AssertionFailure
              ((AssertionFailure *)&gtest_ar_1,0xa2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,"virtual void AssertionTest_assertLeHandlerShouldBeCalled_Test::TestBody()",
               &local_200);
    cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_208);
    pAVar1 = cppassert::internal::AssertionMessage::operator<<
                       ((AssertionMessage *)&local_208,(char (*) [19])"Expected message: ");
    pAVar1 = cppassert::internal::AssertionMessage::operator<<(pAVar1,&a);
    pAVar1 = cppassert::internal::AssertionMessage::operator<<(pAVar1,(char (*) [2])0x160eee);
    pAVar1 = cppassert::internal::AssertionMessage::operator<<(pAVar1,&b);
    cppassert::AssertionFailure::onAssertionFailure((AssertionFailure *)&gtest_ar_1,pAVar1);
    if (local_208._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_208._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    cppassert::AssertionFailure::~AssertionFailure((AssertionFailure *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&local_200);
    if (local_210._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_210._M_head_impl + 8))();
    }
    if (local_220._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_220._M_head_impl + 8))();
    }
  }
  local_200._M_dataplus._M_p._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_1,"2","assertionHandlerCounter_",(int *)&local_200,actual);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_200);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,0xa3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_220,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_220);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_200);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&expectedMsg);
  return;
}

Assistant:

TEST_F(AssertionTest, assertLeHandlerShouldBeCalled)
{
    std::int32_t a = 2;
    std::int32_t b = 1;
    CPP_ASSERT_LE(a, b);
    EXPECT_EQ(1, assertionHandlerCounter_);

    SET_EXPECTED_MSG(a, b);
    CPP_ASSERT_LE(a, b, EXPECTED_TEST_MSG(a,b));
    EXPECT_EQ(2, assertionHandlerCounter_);
}